

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O3

bool __thiscall
glcts::ShaderBitfieldOperationCaseUnpackSnorm::test
          (ShaderBitfieldOperationCaseUnpackSnorm *this,Data *data)

{
  GLuint GVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  
  GVar1 = data->inUvec4[0];
  fVar3 = (float)(int)(char)GVar1 / 127.0;
  fVar4 = 1.0;
  if (fVar3 <= 1.0) {
    fVar4 = fVar3;
  }
  fVar4 = data->outVec4[0] -
          (float)(-(uint)(fVar3 < -1.0) & 0xbf800000 | ~-(uint)(fVar3 < -1.0) & (uint)fVar4);
  uVar2 = -(uint)(-fVar4 <= fVar4);
  if ((float)(~uVar2 & (uint)-fVar4 | (uint)fVar4 & uVar2) <= 0.0001) {
    fVar3 = (float)(int)(char)(GVar1 >> 8) / 127.0;
    fVar4 = 1.0;
    if (fVar3 <= 1.0) {
      fVar4 = fVar3;
    }
    fVar4 = data->outVec4[1] -
            (float)(-(uint)(fVar3 < -1.0) & 0xbf800000 | ~-(uint)(fVar3 < -1.0) & (uint)fVar4);
    uVar2 = -(uint)(-fVar4 <= fVar4);
    if ((float)(~uVar2 & (uint)-fVar4 | (uint)fVar4 & uVar2) <= 0.0001) {
      fVar3 = (float)(int)(char)(GVar1 >> 0x10) / 127.0;
      fVar4 = 1.0;
      if (fVar3 <= 1.0) {
        fVar4 = fVar3;
      }
      fVar4 = data->outVec4[2] -
              (float)(-(uint)(fVar3 < -1.0) & 0xbf800000 | ~-(uint)(fVar3 < -1.0) & (uint)fVar4);
      uVar2 = -(uint)(-fVar4 <= fVar4);
      if ((float)(~uVar2 & (uint)-fVar4 | (uint)fVar4 & uVar2) <= 0.0001) {
        fVar3 = (float)((int)GVar1 >> 0x18) / 127.0;
        fVar4 = 1.0;
        if (fVar3 <= 1.0) {
          fVar4 = fVar3;
        }
        fVar4 = data->outVec4[3] -
                (float)(-(uint)(fVar3 < -1.0) & 0xbf800000 | ~-(uint)(fVar3 < -1.0) & (uint)fVar4);
        uVar2 = -(uint)(-fVar4 <= fVar4);
        return (float)(~uVar2 & (uint)-fVar4 | (uint)fVar4 & uVar2) <= 0.0001;
      }
    }
  }
  return false;
}

Assistant:

virtual bool test(Data const* data)
	{
		GLfloat x = float((signed char)((data->inUvec4[0] >> 0) & 0xFF)) / 127.0f;
		x		  = de::clamp<GLfloat>(x, -1.0f, 1.0f);
		if (deFloatAbs(data->outVec4[0] - x) > 0.0001f)
		{
			return false;
		}
		GLfloat y = float((signed char)((data->inUvec4[0] >> 8) & 0xFF)) / 127.0f;
		y		  = de::clamp<GLfloat>(y, -1.0f, 1.0f);
		if (deFloatAbs(data->outVec4[1] - y) > 0.0001f)
		{
			return false;
		}
		GLfloat z = float((signed char)((data->inUvec4[0] >> 16) & 0xFF)) / 127.0f;
		z		  = de::clamp<GLfloat>(z, -1.0f, 1.0f);
		if (deFloatAbs(data->outVec4[2] - z) > 0.0001f)
		{
			return false;
		}
		GLfloat w = float((signed char)((data->inUvec4[0] >> 24) & 0xFF)) / 127.0f;
		w		  = de::clamp<GLfloat>(w, -1.0f, 1.0f);
		if (deFloatAbs(data->outVec4[3] - w) > 0.0001f)
		{
			return false;
		}

		return true;
	}